

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O0

int CVodeQuadReInit(void *cvode_mem,N_Vector yQ0)

{
  undefined8 in_RSI;
  CVodeMem in_RDI;
  CVodeMem cv_mem;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x4c6,"CVodeQuadReInit",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->cv_QuadMallocDone == 0) {
    cvProcessError(in_RDI,-0x1e,0x4ce,"CVodeQuadReInit",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"Quadrature integration not activated.");
    local_4 = -0x1e;
  }
  else {
    N_VScale(0x3ff0000000000000,in_RSI,in_RDI->cv_znQ[0]);
    in_RDI->cv_nfQe = 0;
    in_RDI->cv_netfQ = 0;
    in_RDI->cv_quadr = 1;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVodeQuadReInit(void* cvode_mem, N_Vector yQ0)
{
  CVodeMem cv_mem;

  /* Check cvode_mem */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Ckeck if quadrature was initialized? */
  if (cv_mem->cv_QuadMallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_QUAD, __LINE__, __func__, __FILE__,
                   MSGCV_NO_QUAD);
    return (CV_NO_QUAD);
  }

  /* Initialize znQ[0] in the history array */
  N_VScale(ONE, yQ0, cv_mem->cv_znQ[0]);

  /* Initialize counters */
  cv_mem->cv_nfQe  = 0;
  cv_mem->cv_netfQ = 0;

  /* Quadrature integration turned ON */
  cv_mem->cv_quadr = SUNTRUE;

  /* Quadrature re-initialization was successfull */
  return (CV_SUCCESS);
}